

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

void __thiscall embree::TutorialBenchmark::TutorialBenchmark(TutorialBenchmark *this,BenchFunc func)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_stack_fffffffffffffc98;
  allocator *paVar1;
  CommandLineParser *in_stack_fffffffffffffca0;
  BenchParams *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffd08;
  string *description;
  anon_class_8_1_8991fb9c_for_f *in_stack_fffffffffffffd10;
  allocator *f;
  string *in_stack_fffffffffffffd18;
  string *name;
  CommandLineParser *in_stack_fffffffffffffd20;
  CommandLineParser *this_00;
  allocator local_289;
  string local_288 [47];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [47];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [47];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [47];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [47];
  undefined1 local_f9 [40];
  allocator local_d1;
  string local_d0 [47];
  undefined1 local_a1 [40];
  allocator local_79;
  string local_78 [47];
  allocator local_49;
  string local_48 [55];
  allocator local_11;
  undefined8 local_10;
  
  *in_RDI = &PTR_postParseCommandLine_00615e28;
  local_10 = in_RSI;
  CommandLineParser::CommandLineParser
            (in_stack_fffffffffffffca0,(Verbosity)((ulong)in_stack_fffffffffffffc98 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xb),"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x11d748);
  BenchParams::BenchParams(in_stack_fffffffffffffcc0);
  in_RDI[0x18] = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"help",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"--help: prints help for all supported command line options",&local_79);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_1_>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  name = (string *)(in_RDI + 1);
  this_00 = (CommandLineParser *)local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a1 + 1),"i",(allocator *)this_00);
  f = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"-i <filepath>: .xml ",f);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_2_>
            (this_00,name,(anon_class_8_1_8991fb9c_for_f *)f,in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)(local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  description = (string *)local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f9 + 1),"c",(allocator *)description);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"-c <filepath>: .ecs ",&local_129);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_3_>
            (this_00,name,(anon_class_8_1_8991fb9c_for_f *)f,description);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"benchmark",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,
             "--benchmark <N> <M>: run benchmark for M seconds (M iterations in legacy mode) with N iterations warm-up"
             ,&local_181);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_4_>
            (this_00,name,(anon_class_8_1_8991fb9c_for_f *)f,description);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"legacy",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d8,"--legacy: run old benchmark version (without google benchmark)",&local_1d9);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_5_>
            (this_00,name,(anon_class_8_1_8991fb9c_for_f *)f,description);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  paVar1 = &local_201;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"benchmark_repetitions",paVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_230,"--benchmark_repetitions <R>: run R repetitions when using google benchmark",
             &local_231);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_6_>
            (this_00,name,(anon_class_8_1_8991fb9c_for_f *)f,description);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"benchmark_name",&local_259);
  paVar1 = &local_289;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_288,"--benchmark_name <string>: override name of the benchmark",paVar1);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_7_>
            (this_00,name,(anon_class_8_1_8991fb9c_for_f *)f,description);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  return;
}

Assistant:

TutorialBenchmark(BenchFunc func) :
    commandLineParser(CommandLineParser(CommandLineParser::SILENT)),
    func(func)
  {
    commandLineParser.registerOption("help", [this] (Ref<ParseStream> cin, const FileName& path) {
        commandLineParser.printCommandLineHelp();
        exit(1);
      }, "--help: prints help for all supported command line options");
    commandLineParser.registerOption("i", [&] (Ref<ParseStream> cin, const FileName& path) {
        inputFile = cin->getString();
      }, "-i <filepath>: .xml ");
    commandLineParser.registerOption("c", [&] (Ref<ParseStream> cin, const FileName& path) {
        inputFile = cin->getString();
      }, "-c <filepath>: .ecs ");
    commandLineParser.registerOption("benchmark", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.skipIterations = cin->getInt();
        params.minTimeOrIterations = cin->getInt();
        processedCommandLineOptions.push_back("--benchmark");
      }, "--benchmark <N> <M>: run benchmark for M seconds (M iterations in legacy mode) with N iterations warm-up");
    commandLineParser.registerOption("legacy", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.legacy = true;
        processedCommandLineOptions.push_back("--legacy");
      }, "--legacy: run old benchmark version (without google benchmark)");
    commandLineParser.registerOption("benchmark_repetitions", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.repetitions = cin->getInt();
        processedCommandLineOptions.push_back("--benchmark_repetitions");
      }, "--benchmark_repetitions <R>: run R repetitions when using google benchmark");
    commandLineParser.registerOption("benchmark_name", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.name = cin->getString();
        processedCommandLineOptions.push_back("--benchmark_name");
      }, "--benchmark_name <string>: override name of the benchmark");
  }